

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O2

QFixed __thiscall
QTextDocumentLayoutPrivate::findY
          (QTextDocumentLayoutPrivate *this,QFixed yFrom,QTextLayoutStruct *layoutStruct,
          QFixed requiredWidth)

{
  QFixed QVar1;
  QTextFrameData *pQVar2;
  QTextFrameData *pQVar3;
  int iVar4;
  QFixed y;
  int i;
  ulong uVar5;
  long lVar6;
  long in_FS_OFFSET;
  QFixed local_40;
  QFixed local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c.val = 0;
  local_40.val = 0;
  QVar1.val = (layoutStruct->x_right).val - (layoutStruct->x_left).val;
  if (requiredWidth.val <= QVar1.val) {
    QVar1.val = requiredWidth.val;
  }
  do {
    y.val = yFrom.val;
    floatMargins(this,y,layoutStruct,&local_40,&local_3c);
    if (QVar1.val <= local_3c.val - local_40.val) break;
    this = (QTextDocumentLayoutPrivate *)layoutStruct->frame;
    pQVar2 = ::data((QTextFrame *)this);
    yFrom.val = 0x1fffffc0;
    lVar6 = 8;
    for (uVar5 = 0; uVar5 < (ulong)(pQVar2->floats).d.size; uVar5 = uVar5 + 1) {
      this = *(QTextDocumentLayoutPrivate **)((long)&(((pQVar2->floats).d.ptr)->wp).d + lVar6);
      pQVar3 = ::data((QTextFrame *)this);
      if ((((pQVar3->layoutDirty == false) && (iVar4 = (pQVar3->position).y.val, iVar4 <= y.val)) &&
          (iVar4 = iVar4 + (pQVar3->size).height.val, y.val < iVar4)) && (iVar4 <= yFrom.val)) {
        yFrom.val = iVar4;
      }
      lVar6 = lVar6 + 0x10;
    }
  } while (yFrom.val != 0x1fffffc0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QFixed)y.val;
}

Assistant:

QFixed QTextDocumentLayoutPrivate::findY(QFixed yFrom, const QTextLayoutStruct *layoutStruct, QFixed requiredWidth) const
{
    QFixed right, left;
    requiredWidth = qMin(requiredWidth, layoutStruct->x_right - layoutStruct->x_left);

//     qDebug() << "findY:" << yFrom;
    while (1) {
        floatMargins(yFrom, layoutStruct, &left, &right);
//         qDebug() << "    yFrom=" << yFrom<<"right=" << right << "left=" << left << "requiredWidth=" << requiredWidth;
        if (right-left >= requiredWidth)
            break;

        // move float down until we find enough space
        QFixed newY = QFIXED_MAX;
        QTextFrameData *lfd = data(layoutStruct->frame);
        for (int i = 0; i < lfd->floats.size(); ++i) {
            QTextFrameData *fd = data(lfd->floats.at(i));
            if (!fd->layoutDirty) {
                if (fd->position.y <= yFrom && fd->position.y + fd->size.height > yFrom)
                    newY = qMin(newY, fd->position.y + fd->size.height);
            }
        }
        if (newY == QFIXED_MAX)
            break;
        yFrom = newY;
    }
    return yFrom;
}